

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterWriteIndent(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = xmlListSize(writer->nodes);
  if (0 < iVar1) {
    iVar3 = iVar1 + -1;
    do {
      iVar1 = iVar1 + -1;
      if (iVar1 == 0) {
        return iVar3;
      }
      iVar2 = xmlOutputBufferWriteString(writer->out,(char *)writer->ichar);
    } while (iVar2 != -1);
  }
  return -1;
}

Assistant:

static int
xmlTextWriterWriteIndent(xmlTextWriterPtr writer)
{
    int lksize;
    int i;
    int ret;

    lksize = xmlListSize(writer->nodes);
    if (lksize < 1)
        return (-1);            /* list is empty */
    for (i = 0; i < (lksize - 1); i++) {
        ret = xmlOutputBufferWriteString(writer->out,
                                         (const char *) writer->ichar);
        if (ret == -1)
            return (-1);
    }

    return (lksize - 1);
}